

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.c
# Opt level: O3

wchar_t tok_wline(TokenizerW *tok,LineInfoW *line,wchar_t *argc,wchar_t ***argv,wchar_t *cursorc,
                 wchar_t *cursoro)

{
  wchar_t wVar1;
  size_t sVar2;
  wchar_t *pwVar3;
  wchar_t **ppwVar4;
  size_t sVar5;
  wchar_t *pwVar6;
  wchar_t *pwVar7;
  long lVar8;
  wchar_t wVar9;
  ulong uVar10;
  wchar_t local_54;
  
  pwVar7 = line->buffer;
  uVar10 = 0xffffffff;
  local_54 = L'\xffffffff';
LAB_00111e96:
  if (line->lastchar <= pwVar7) {
    pwVar7 = anon_var_dwarf_17484 + 3;
  }
  if (pwVar7 == line->cursor) {
    local_54 = (wchar_t)tok->argc;
    uVar10 = (ulong)((long)tok->wptr - (long)tok->wstart) >> 2;
  }
  wVar9 = (wchar_t)uVar10;
  wVar1 = *pwVar7;
  if (wVar1 < L'\"') {
    if (wVar1 == L'\0') {
      switch(tok->quote) {
      case Q_none:
        if ((tok->flags & 2U) != 0) {
          tok->flags = tok->flags & 0xfffffffd;
          return L'\x03';
        }
switchD_00111f46_caseD_0:
        if ((local_54 == L'\xffffffff') && (wVar9 == L'\xffffffff')) {
          local_54 = (wchar_t)tok->argc;
          wVar9 = (wchar_t)((ulong)((long)tok->wptr - (long)tok->wstart) >> 2);
        }
        if (cursorc != (wchar_t *)0x0) {
          *cursorc = local_54;
        }
        if (cursoro != (wchar_t *)0x0) {
          *cursoro = wVar9;
        }
        tok_wfinish(tok);
        *argv = tok->argv;
        *argc = (wchar_t)tok->argc;
        return L'\0';
      case Q_single:
      case Q_double:
        return tok->quote;
      case Q_one:
        goto switchD_00111f01_caseD_3;
      case Q_doubleone:
        goto switchD_00111f01_caseD_4;
      default:
        return L'\xffffffff';
      }
    }
    if (wVar1 == L'\n') {
      wVar1 = tok->flags;
      tok->flags = wVar1 & 0xfffffffd;
      switch(tok->quote) {
      case Q_none:
        goto switchD_00111f46_caseD_0;
      case Q_single:
      case Q_double:
        goto switchD_00111f01_caseD_2;
      case Q_one:
        tok->flags = wVar1 | 2;
        goto switchD_00111f01_caseD_1;
      case Q_doubleone:
        tok->flags = wVar1 | 2;
        goto switchD_00111f79_caseD_0;
      default:
        return L'\0';
      }
    }
LAB_00111fd5:
    *(byte *)&tok->flags = (byte)tok->flags & 0xfd;
    switch(tok->quote) {
    case Q_none:
      wVar1 = *pwVar7;
      pwVar3 = wcschr(tok->ifs,wVar1);
      if (pwVar3 == (wchar_t *)0x0) {
        pwVar3 = tok->wptr;
        tok->wptr = pwVar3 + 1;
        *pwVar3 = wVar1;
      }
      else {
        tok_wfinish(tok);
      }
      break;
    case Q_single:
    case Q_double:
      goto switchD_00111f01_caseD_2;
    case Q_one:
      goto switchD_00111f01_caseD_3;
    case Q_doubleone:
      pwVar3 = tok->wptr;
      *pwVar3 = L'\\';
      tok->quote = Q_double;
      wVar1 = *pwVar7;
      tok->wptr = pwVar3 + 2;
      pwVar3[1] = wVar1;
      break;
    default:
      goto switchD_00111fca_caseD_1;
    }
    goto LAB_00112031;
  }
  if (wVar1 != L'\"') {
    if (wVar1 == L'\\') {
      tok->flags = (tok->flags & 0xfffffffcU) + L'\x01';
      switch(tok->quote) {
      case Q_none:
        tok->quote = Q_one;
        break;
      case Q_single:
        goto switchD_00111f01_caseD_2;
      case Q_double:
        tok->quote = Q_doubleone;
        break;
      case Q_one:
        wVar1 = *pwVar7;
        pwVar3 = tok->wptr;
        tok->wptr = pwVar3 + 1;
        *pwVar3 = wVar1;
        goto switchD_00111f01_caseD_1;
      case Q_doubleone:
        goto switchD_00111f01_caseD_4;
      default:
        goto switchD_00111fca_caseD_1;
      }
    }
    else {
      if (wVar1 != L'\'') goto LAB_00111fd5;
      tok->flags = (tok->flags & 0xfffffffcU) + L'\x01';
      switch(tok->quote) {
      case Q_none:
        tok->quote = Q_single;
        break;
      case Q_single:
        goto switchD_00111f01_caseD_1;
      case Q_double:
        goto switchD_00111f01_caseD_2;
      case Q_one:
        goto switchD_00111f01_caseD_3;
      case Q_doubleone:
        goto switchD_00111f01_caseD_4;
      default:
        goto switchD_00111fca_caseD_1;
      }
    }
    goto LAB_00112031;
  }
  tok->flags = (tok->flags & 0xfffffffcU) + L'\x01';
  switch(tok->quote) {
  case Q_none:
switchD_00111f79_caseD_0:
    tok->quote = Q_double;
    break;
  case Q_single:
    goto switchD_00111f01_caseD_2;
  case Q_double:
switchD_00111f01_caseD_1:
    tok->quote = Q_none;
    break;
  case Q_one:
    goto switchD_00111f01_caseD_3;
  case Q_doubleone:
switchD_00111f01_caseD_4:
    tok->quote = Q_double;
    goto switchD_00111f01_caseD_2;
  default:
    goto switchD_00111fca_caseD_1;
  }
LAB_00112031:
  if (tok->wmax + -4 <= tok->wptr) {
    lVar8 = (long)tok->wmax - (long)tok->wspace >> 2;
    pwVar3 = (wchar_t *)realloc(tok->wspace,lVar8 * 4 + 0x50);
    if (pwVar3 == (wchar_t *)0x0) {
      return L'\xffffffff';
    }
    pwVar6 = tok->wspace;
    if (pwVar3 != pwVar6) {
      sVar2 = tok->argc;
      if (sVar2 != 0) {
        sVar5 = 0;
        do {
          tok->argv[sVar5] =
               (wchar_t *)(((long)tok->argv[sVar5] - (long)tok->wspace) + (long)pwVar3);
          sVar5 = sVar5 + 1;
        } while (sVar2 != sVar5);
        pwVar6 = tok->wspace;
      }
      tok->wptr = (wchar_t *)(((long)tok->wptr - (long)pwVar6) + (long)pwVar3);
      tok->wstart = (wchar_t *)(((long)tok->wstart - (long)pwVar6) + (long)pwVar3);
      tok->wspace = pwVar3;
    }
    tok->wmax = pwVar3 + lVar8 + 0x14;
  }
  sVar2 = tok->amax;
  if (sVar2 - 4 <= tok->argc) {
    tok->amax = sVar2 + 10;
    ppwVar4 = (wchar_t **)realloc(tok->argv,sVar2 * 8 + 0x50);
    if (ppwVar4 == (wchar_t **)0x0) {
      tok->amax = tok->amax - 10;
switchD_00111fca_caseD_1:
      return L'\xffffffff';
    }
    tok->argv = ppwVar4;
  }
  pwVar7 = pwVar7 + 1;
  goto LAB_00111e96;
switchD_00111f01_caseD_3:
  tok->quote = Q_none;
switchD_00111f01_caseD_2:
  wVar1 = *pwVar7;
  pwVar3 = tok->wptr;
  tok->wptr = pwVar3 + 1;
  *pwVar3 = wVar1;
  goto LAB_00112031;
}

Assistant:

int
FUN(tok,line)(TYPE(Tokenizer) *tok, const TYPE(LineInfo) *line,
    int *argc, const Char ***argv, int *cursorc, int *cursoro)
{
	const Char *ptr;
	int cc, co;

	cc = co = -1;
	ptr = line->buffer;
	for (ptr = line->buffer; ;ptr++) {
		if (ptr >= line->lastchar)
			ptr = STR("");
		if (ptr == line->cursor) {
			cc = (int)tok->argc;
			co = (int)(tok->wptr - tok->wstart);
		}
		switch (*ptr) {
		case '\'':
			tok->flags |= TOK_KEEP;
			tok->flags &= ~TOK_EAT;
			switch (tok->quote) {
			case Q_none:
				tok->quote = Q_single;	/* Enter single quote
							 * mode */
				break;

			case Q_single:	/* Exit single quote mode */
				tok->quote = Q_none;
				break;

			case Q_one:	/* Quote this ' */
				tok->quote = Q_none;
				*tok->wptr++ = *ptr;
				break;

			case Q_double:	/* Stay in double quote mode */
				*tok->wptr++ = *ptr;
				break;

			case Q_doubleone:	/* Quote this ' */
				tok->quote = Q_double;
				*tok->wptr++ = *ptr;
				break;

			default:
				return -1;
			}
			break;

		case '"':
			tok->flags &= ~TOK_EAT;
			tok->flags |= TOK_KEEP;
			switch (tok->quote) {
			case Q_none:	/* Enter double quote mode */
				tok->quote = Q_double;
				break;

			case Q_double:	/* Exit double quote mode */
				tok->quote = Q_none;
				break;

			case Q_one:	/* Quote this " */
				tok->quote = Q_none;
				*tok->wptr++ = *ptr;
				break;

			case Q_single:	/* Stay in single quote mode */
				*tok->wptr++ = *ptr;
				break;

			case Q_doubleone:	/* Quote this " */
				tok->quote = Q_double;
				*tok->wptr++ = *ptr;
				break;

			default:
				return -1;
			}
			break;

		case '\\':
			tok->flags |= TOK_KEEP;
			tok->flags &= ~TOK_EAT;
			switch (tok->quote) {
			case Q_none:	/* Quote next character */
				tok->quote = Q_one;
				break;

			case Q_double:	/* Quote next character */
				tok->quote = Q_doubleone;
				break;

			case Q_one:	/* Quote this, restore state */
				*tok->wptr++ = *ptr;
				tok->quote = Q_none;
				break;

			case Q_single:	/* Stay in single quote mode */
				*tok->wptr++ = *ptr;
				break;

			case Q_doubleone:	/* Quote this \ */
				tok->quote = Q_double;
				*tok->wptr++ = *ptr;
				break;

			default:
				return -1;
			}
			break;

		case '\n':
			tok->flags &= ~TOK_EAT;
			switch (tok->quote) {
			case Q_none:
				goto tok_line_outok;

			case Q_single:
			case Q_double:
				*tok->wptr++ = *ptr;	/* Add the return */
				break;

			case Q_doubleone:   /* Back to double, eat the '\n' */
				tok->flags |= TOK_EAT;
				tok->quote = Q_double;
				break;

			case Q_one:	/* No quote, more eat the '\n' */
				tok->flags |= TOK_EAT;
				tok->quote = Q_none;
				break;

			default:
				return 0;
			}
			break;

		case '\0':
			switch (tok->quote) {
			case Q_none:
				/* Finish word and return */
				if (tok->flags & TOK_EAT) {
					tok->flags &= ~TOK_EAT;
					return 3;
				}
				goto tok_line_outok;

			case Q_single:
				return 1;

			case Q_double:
				return 2;

			case Q_doubleone:
				tok->quote = Q_double;
				*tok->wptr++ = *ptr;
				break;

			case Q_one:
				tok->quote = Q_none;
				*tok->wptr++ = *ptr;
				break;

			default:
				return -1;
			}
			break;

		default:
			tok->flags &= ~TOK_EAT;
			switch (tok->quote) {
			case Q_none:
				if (Strchr(tok->ifs, *ptr) != NULL)
					FUN(tok,finish)(tok);
				else
					*tok->wptr++ = *ptr;
				break;

			case Q_single:
			case Q_double:
				*tok->wptr++ = *ptr;
				break;


			case Q_doubleone:
				*tok->wptr++ = '\\';
				tok->quote = Q_double;
				*tok->wptr++ = *ptr;
				break;

			case Q_one:
				tok->quote = Q_none;
				*tok->wptr++ = *ptr;
				break;

			default:
				return -1;

			}
			break;
		}

		if (tok->wptr >= tok->wmax - 4) {
			size_t size = (size_t)(tok->wmax - tok->wspace + WINCR);
			Char *s = tok_realloc(tok->wspace,
			    size * sizeof(*s));
			if (s == NULL)
				return -1;

			if (s != tok->wspace) {
				size_t i;
				for (i = 0; i < tok->argc; i++) {
				    tok->argv[i] =
					(tok->argv[i] - tok->wspace) + s;
				}
				tok->wptr = (tok->wptr - tok->wspace) + s;
				tok->wstart = (tok->wstart - tok->wspace) + s;
				tok->wspace = s;
			}
			tok->wmax = s + size;
		}
		if (tok->argc >= tok->amax - 4) {
			const Char **p;
			tok->amax += AINCR;
			p = tok_realloc(tok->argv, tok->amax * sizeof(*p));
			if (p == NULL) {
				tok->amax -= AINCR;
				return -1;
			}
			tok->argv = p;
		}
	}
 tok_line_outok:
	if (cc == -1 && co == -1) {
		cc = (int)tok->argc;
		co = (int)(tok->wptr - tok->wstart);
	}
	if (cursorc != NULL)
		*cursorc = cc;
	if (cursoro != NULL)
		*cursoro = co;
	FUN(tok,finish)(tok);
	*argv = tok->argv;
	*argc = (int)tok->argc;
	return 0;
}